

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

BOOL InitializeCriticalSectionEx(LPCRITICAL_SECTION lpCriticalSection,DWORD dwSpinCount,DWORD Flags)

{
  if (PAL_InitializeChakraCoreCalled) {
    CorUnix::InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,dwSpinCount,false);
    if (PAL_InitializeChakraCoreCalled != false) {
      return 1;
    }
  }
  abort();
}

Assistant:

BOOL InitializeCriticalSectionEx(LPCRITICAL_SECTION lpCriticalSection, DWORD dwSpinCount, DWORD Flags)
{
    PERF_ENTRY(InitializeCriticalSection);
    ENTRY("InitializeCriticalSectionEx(lpCriticalSection=%p, dwSpinCount=%d, Flags=%d)\n",
          lpCriticalSection, dwSpinCount, Flags);

    InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection, dwSpinCount, false);

    LOGEXIT("InitializeCriticalSectionEx returns TRUE\n");
    PERF_EXIT(InitializeCriticalSection);
    return true;
}